

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-flow-kill.c
# Opt level: O0

void borg_delete_kill(wchar_t i)

{
  _Bool _Var1;
  borg_kill *__s;
  char *pcVar2;
  borg_kill *kill;
  wchar_t i_local;
  
  __s = borg_kills + i;
  if (__s->r_idx != 0) {
    pcVar2 = borg_race_name((uint)__s->r_idx);
    pcVar2 = format("# Forgetting a monster \'%s\' at (%d,%d)",pcVar2,(ulong)(uint)(__s->pos).y,
                    (ulong)(uint)(__s->pos).x);
    borg_note(pcVar2);
    if (((borg.goal.type == 1) && ((uint)borg_flow_y[0] == (__s->pos).y)) &&
       ((uint)borg_flow_x[0] == (__s->pos).x)) {
      borg.goal.type = 0;
    }
    borg_grids[(__s->pos).y][(__s->pos).x].kill = '\0';
    _Var1 = flag_has_dbg(r_info[__s->r_idx].flags,0xb,0x11,"r_info[kill->r_idx].flags","RF_MULTIPLY"
                        );
    if (_Var1) {
      borg.when_last_kill_mult = borg_t;
    }
    memset(__s,0,0x1d8);
    borg_kills_cnt = borg_kills_cnt + -1;
    borg_danger_wipe = true;
  }
  return;
}

Assistant:

void borg_delete_kill(int i)
{
    borg_kill *kill = &borg_kills[i];

    /* Paranoia -- Already wiped */
    if (!kill->r_idx)
        return;

    /* Note */
    borg_note(format("# Forgetting a monster '%s' at (%d,%d)",
        borg_race_name(kill->r_idx), kill->pos.y, kill->pos.x));
    /* Clear goals if I am flowing to this monster.*/
    if (borg.goal.type == GOAL_KILL && borg_flow_y[0] == kill->pos.y
        && borg_flow_x[0] == kill->pos.x)
        borg.goal.type = 0;

    /* Update the grids */
    borg_grids[kill->pos.y][kill->pos.x].kill = 0;

    /* save a time stamp of when the last multiplier was killed */
    if (rf_has(r_info[kill->r_idx].flags, RF_MULTIPLY))
        borg.when_last_kill_mult = borg_t;

    /* Kill the monster */
    memset(kill, 0, sizeof(borg_kill));

    /* One less monster */
    borg_kills_cnt--;

    /* Recalculate danger */
    borg_danger_wipe = true;
}